

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzcheckmesh.cpp
# Opt level: O2

void __thiscall TPZCheckMesh::DependencyReport(TPZCheckMesh *this,int connect,TPZCompElSide *large)

{
  long *plVar1;
  int iVar2;
  ostream *poVar3;
  ulong uVar4;
  ulong uVar5;
  TPZCompElSide local_280;
  TPZStack<TPZCompElSide,_10> equal;
  TPZStack<TPZCompElSide,_10> highdim;
  TPZStack<TPZCompElSide,_10> smalll;
  
  TPZStack<TPZCompElSide,_10>::TPZStack(&smalll);
  TPZCompElSide::HigherLevelElementList(large,&smalll,1,1);
  uVar4 = 0;
  uVar5 = (ulong)(uint)smalll.super_TPZManVector<TPZCompElSide,_10>.super_TPZVec<TPZCompElSide>.
                       fNElements;
  if ((int)(uint)smalll.super_TPZManVector<TPZCompElSide,_10>.super_TPZVec<TPZCompElSide>.fNElements
      < 1) {
    uVar5 = uVar4;
  }
  for (; uVar5 * 0x10 != uVar4; uVar4 = uVar4 + 0x10) {
    plVar1 = *(long **)((long)&(smalll.super_TPZManVector<TPZCompElSide,_10>.
                                super_TPZVec<TPZCompElSide>.fStore)->fEl + uVar4);
    iVar2 = (**(code **)(*plVar1 + 0xa0))
                      (plVar1,*(undefined4 *)
                               ((long)&(smalll.super_TPZManVector<TPZCompElSide,_10>.
                                        super_TPZVec<TPZCompElSide>.fStore)->fSide + uVar4));
    poVar3 = std::operator<<(this->fOut,"Connect ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,iVar2);
    poVar3 = std::operator<<(poVar3," may depend on ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,connect);
    std::endl<char,std::char_traits<char>>(poVar3);
  }
  TPZCompElSide::Reference((TPZGeoElSide *)&equal,large);
  iVar2 = TPZGeoElSide::Dimension((TPZGeoElSide *)&equal);
  if (iVar2 == 1) {
    TPZStack<TPZCompElSide,_10>::TPZStack(&equal);
    TPZCompElSide::EqualLevelElementList(large,&equal,1,0);
    local_280.fEl = large->fEl;
    local_280.fSide = large->fSide;
    TPZStack<TPZCompElSide,_10>::Push(&equal,&local_280);
    TPZStack<TPZCompElSide,_10>::TPZStack(&highdim);
    uVar4 = 0;
    uVar5 = (ulong)(uint)equal.super_TPZManVector<TPZCompElSide,_10>.super_TPZVec<TPZCompElSide>.
                         fNElements;
    if ((int)(uint)equal.super_TPZManVector<TPZCompElSide,_10>.super_TPZVec<TPZCompElSide>.
                   fNElements < 1) {
      uVar5 = uVar4;
    }
    for (; uVar5 * 0x10 != uVar4; uVar4 = uVar4 + 0x10) {
      TPZCompElSide::HigherDimensionElementList
                ((TPZCompElSide *)
                 ((long)&(equal.super_TPZManVector<TPZCompElSide,_10>.super_TPZVec<TPZCompElSide>.
                         fStore)->fEl + uVar4),&highdim,1,0);
    }
    uVar4 = 0;
    TPZCompElSide::HigherDimensionElementList(large,&highdim,1,0);
    uVar5 = (ulong)(uint)highdim.super_TPZManVector<TPZCompElSide,_10>.super_TPZVec<TPZCompElSide>.
                         fNElements;
    if ((int)(uint)highdim.super_TPZManVector<TPZCompElSide,_10>.super_TPZVec<TPZCompElSide>.
                   fNElements < 1) {
      uVar5 = uVar4;
    }
    for (; uVar5 * 0x10 != uVar4; uVar4 = uVar4 + 0x10) {
      DependencyReport(this,connect,
                       (TPZCompElSide *)
                       ((long)&(highdim.super_TPZManVector<TPZCompElSide,_10>.
                                super_TPZVec<TPZCompElSide>.fStore)->fEl + uVar4));
    }
    TPZManVector<TPZCompElSide,_10>::~TPZManVector(&highdim.super_TPZManVector<TPZCompElSide,_10>);
    TPZManVector<TPZCompElSide,_10>::~TPZManVector(&equal.super_TPZManVector<TPZCompElSide,_10>);
  }
  TPZManVector<TPZCompElSide,_10>::~TPZManVector(&smalll.super_TPZManVector<TPZCompElSide,_10>);
  return;
}

Assistant:

void TPZCheckMesh::DependencyReport(int connect, TPZCompElSide & large) {
	
	TPZStack<TPZCompElSide> smalll;
	large.HigherLevelElementList(smalll,1,1);
	int nsmall = smalll.NElements();
	int is;
	for(is=0; is<nsmall; is++) {
		int conind = smalll[is].Element()->ConnectIndex(smalll[is].Side());
		(*fOut) << "Connect " << conind << " may depend on " << connect << endl;
	}
	if(large.Reference().Dimension() == 1) {
		TPZStack<TPZCompElSide> equal;
		large.EqualLevelElementList(equal,1,0);
		equal.Push(large);
		TPZStack<TPZCompElSide> highdim;
		int neq = equal.NElements();
		int eq;
		for(eq=0; eq<neq; eq++) equal[eq].HigherDimensionElementList(highdim,1,0);
		large.HigherDimensionElementList(highdim,1,0);
		int nhigh = highdim.NElements();
		int ih;
		for(ih=0; ih<nhigh; ih++) {
			DependencyReport(connect,highdim[ih]);
		}
	}
}